

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QTextCharFormat> * __thiscall
QList<QTextCharFormat>::fill(QList<QTextCharFormat> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QTextCharFormat> *pQVar3;
  DataOps *n;
  parameter_type in_RDX;
  __off_t __length;
  QArrayDataPointer<QTextCharFormat> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QTextCharFormat copy;
  QArrayDataPointer<QTextCharFormat> *in_stack_ffffffffffffff68;
  parameter_type pQVar4;
  QArrayDataPointer<QTextCharFormat> *in_stack_ffffffffffffff70;
  QTextCharFormat *in_stack_ffffffffffffff78;
  QArrayDataPointer<QTextCharFormat> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QArrayDataPointer<QTextCharFormat> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QTextCharFormat> local_38;
  parameter_type local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDX;
  if (in_RDX == (parameter_type)0xffffffffffffffff) {
    local_20 = (parameter_type)size((QList<QTextCharFormat> *)in_RDI);
  }
  QArrayDataPointer<QTextCharFormat>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QTextCharFormat>::needsDetach(in_stack_ffffffffffffff70);
  pQVar4 = local_20;
  if ((bVar1) || (qVar2 = capacity((QList<QTextCharFormat> *)0x79c6e6), qVar2 < (long)pQVar4)) {
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QTextCharFormat>::operator->(in_RDI);
    QArrayDataPointer<QTextCharFormat>::detachCapacity
              (in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    QArrayDataPointer<QTextCharFormat>::QArrayDataPointer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,
               (AllocationOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QTextCharFormat>::operator->(&local_38);
    QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
              ((QGenericArrayOps<QTextCharFormat> *)in_stack_ffffffffffffff80,
               (qsizetype)in_stack_ffffffffffffff78,(parameter_type)in_stack_ffffffffffffff70);
    QArrayDataPointer<QTextCharFormat>::swap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<QTextCharFormat>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat
              ((QTextCharFormat *)in_stack_ffffffffffffff70,
               (QTextCharFormat *)in_stack_ffffffffffffff68);
    QArrayDataPointer<QTextCharFormat>::operator->(in_RDI);
    QArrayDataPointer<QTextCharFormat>::begin((QArrayDataPointer<QTextCharFormat> *)0x79c7cb);
    pQVar3 = (QGenericArrayOps<QTextCharFormat> *)
             QArrayDataPointer<QTextCharFormat>::begin
                       ((QArrayDataPointer<QTextCharFormat> *)0x79c7da);
    local_40 = size((QList<QTextCharFormat> *)in_RDI);
    qMin<long_long>(&local_40,(longlong *)&local_20);
    QtPrivate::QGenericArrayOps<QTextCharFormat>::assign
              (pQVar3,in_stack_ffffffffffffff78,(QTextCharFormat *)in_stack_ffffffffffffff70,
               (parameter_type)in_stack_ffffffffffffff68);
    pQVar4 = local_20;
    qVar2 = size((QList<QTextCharFormat> *)in_RDI);
    if (qVar2 < (long)pQVar4) {
      n = QArrayDataPointer<QTextCharFormat>::operator->(in_RDI);
      pQVar4 = local_20;
      size((QList<QTextCharFormat> *)in_RDI);
      QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend(pQVar3,(qsizetype)n,pQVar4);
    }
    else {
      pQVar4 = local_20;
      qVar2 = size((QList<QTextCharFormat> *)in_RDI);
      if ((long)pQVar4 < qVar2) {
        pQVar3 = (QGenericArrayOps<QTextCharFormat> *)
                 QArrayDataPointer<QTextCharFormat>::operator->(in_RDI);
        QtPrivate::QGenericArrayOps<QTextCharFormat>::truncate(pQVar3,(char *)local_20,__length);
      }
    }
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x79c8c5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QTextCharFormat> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}